

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O1

IXML_Node * ixmlNamedNodeMap_getNamedItem(IXML_NamedNodeMap *nnMap,char *name)

{
  int iVar1;
  IXML_Node *pIVar2;
  unsigned_long uVar3;
  unsigned_long index;
  
  if (name != (char *)0x0 && nnMap != (IXML_NamedNodeMap *)0x0) {
    pIVar2 = nnMap->nodeItem;
    index = 0x6b;
    if (pIVar2 != (IXML_Node *)0x0) {
      uVar3 = 0;
      do {
        iVar1 = strcmp(name,pIVar2->nodeName);
        index = uVar3;
        if (iVar1 == 0) break;
        uVar3 = uVar3 + 1;
        pIVar2 = pIVar2->nextSibling;
        index = 0x6b;
      } while (pIVar2 != (Nodeptr)0x0);
    }
    if (index != 0x6b) {
      pIVar2 = ixmlNamedNodeMap_item(nnMap,index);
      return pIVar2;
    }
  }
  return (IXML_Node *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_getNamedItem(
	IXML_NamedNodeMap *nnMap, const DOMString name)
{
	unsigned long index;

	if (nnMap == NULL || name == NULL) {
		return NULL;
	}

	index = ixmlNamedNodeMap_getItemNumber(nnMap, name);
	if (index == (unsigned long)IXML_INVALID_ITEM_NUMBER) {
		return NULL;
	} else {
		return ixmlNamedNodeMap_item(nnMap, index);
	}
}